

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

base_learner * GD::setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  size_t *psVar2;
  _func_float_gd_ptr_base_learner_ptr_example_ptr *p_Var3;
  undefined8 uVar4;
  double dVar5;
  _Head_base<0UL,_GD::gd_*,_false> _Var6;
  options_i *this;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  option_group_definition *poVar11;
  typed_option<float> *ptVar12;
  typed_option<double> *ptVar13;
  typed_option<unsigned_long> *ptVar14;
  size_t sVar15;
  ostream *poVar16;
  code *pcVar17;
  uint64_t uVar18;
  learner<GD::gd,_example> *plVar19;
  vw_exception *this_00;
  code *pcVar20;
  uint32_t *puVar21;
  code *pcVar22;
  bool bVar23;
  byte bVar24;
  bool bVar25;
  float fVar26;
  bool normalized;
  bool invariant;
  bool adaptive;
  bool adax;
  bool sgd;
  free_ptr<GD::gd> g;
  option_group_definition new_options;
  stringstream __msg;
  bool local_dad;
  bool local_dac;
  bool local_dab;
  bool local_daa;
  bool local_da9;
  free_ptr<GD::gd> local_da8;
  options_i *local_d98;
  string local_d90;
  undefined1 *local_d70 [2];
  undefined1 local_d60 [16];
  string local_d50;
  undefined1 *local_d30 [2];
  undefined1 local_d20 [16];
  string local_d10;
  undefined1 *local_cf0 [2];
  undefined1 local_ce0 [16];
  string local_cd0;
  undefined1 *local_cb0 [2];
  undefined1 local_ca0 [16];
  string local_c90;
  undefined1 *local_c70 [2];
  undefined1 local_c60 [16];
  string local_c50;
  undefined1 *local_c30 [2];
  undefined1 local_c20 [16];
  string local_c10;
  undefined1 *local_bf0;
  long local_be8;
  undefined1 local_be0 [16];
  option_group_definition local_bd0;
  undefined1 *local_b98 [2];
  undefined1 local_b88 [16];
  string local_b78;
  undefined1 *local_b58 [2];
  undefined1 local_b48 [16];
  string local_b38;
  undefined1 local_b18 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a80;
  undefined1 local_a78 [48];
  string local_a48 [88];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9e0;
  undefined1 local_8f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_868;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_858;
  undefined1 local_850 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7b8;
  undefined1 local_7b0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_728;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_718;
  typed_option<double> local_710;
  typed_option<double> local_670;
  typed_option<double> local_5d0;
  typed_option<double> local_530;
  typed_option<float> local_490;
  typed_option<float> local_3f0;
  typed_option<bool> local_350;
  typed_option<bool> local_2b0;
  typed_option<bool> local_210;
  typed_option<bool> local_170;
  typed_option<bool> local_d0;
  
  local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl = calloc_or_throw<GD::gd>(1);
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->total_weight = 0.0;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->no_win_counter = 0;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->early_stop_thres = 0;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->initial_constant = 0.0;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->neg_norm_power = 0.0;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->neg_power_t = 0.0;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->sparse_l2 = 0.0;
  *(undefined8 *)
   &(local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->update_multiplier = 0;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->predict = (_func_void_gd_ptr_base_learner_ptr_example_ptr *)0x0;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->learn = (_func_void_gd_ptr_base_learner_ptr_example_ptr *)0x0;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->update = (_func_void_gd_ptr_base_learner_ptr_example_ptr *)0x0;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->sensitivity = (_func_float_gd_ptr_base_learner_ptr_example_ptr *)0x0;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->multipredict =
       (_func_void_gd_ptr_base_learner_ptr_example_ptr_size_t_size_t_polyprediction_ptr_bool *)0x0;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->normalized = false;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->adaptive = false;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->adax = false;
  *(undefined5 *)
   &(local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->field_0x5b = 0;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->all = (vw *)0x0;
  local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<GD::gd>;
  local_da9 = false;
  local_dab = false;
  local_daa = false;
  local_dac = false;
  local_dad = false;
  local_bf0 = local_be0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_bf0,"Gradient Descent options","");
  local_bd0.m_name._M_dataplus._M_p = (pointer)&local_bd0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_bd0,local_bf0,local_bf0 + local_be8);
  local_bd0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_bd0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_bd0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_bf0 != local_be0) {
    operator_delete(local_bf0);
  }
  local_c10._M_dataplus._M_p = (pointer)&local_c10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c10,"sgd","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_a78,&local_c10,&local_da9);
  local_c30[0] = local_c20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c30,"use regular stochastic gradient descent update.","");
  std::__cxx11::string::_M_assign(local_a48);
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_a78);
  poVar11 = VW::config::option_group_definition::add<bool>(&local_bd0,&local_d0);
  local_c50._M_dataplus._M_p = (pointer)&local_c50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c50,"adaptive","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_b18,&local_c50,&local_dab);
  local_c70[0] = local_c60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c70,"use adaptive, individual learning rates.","");
  std::__cxx11::string::_M_assign((string *)(local_b18 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_b18);
  poVar11 = VW::config::option_group_definition::add<bool>(poVar11,&local_170);
  local_c90._M_dataplus._M_p = (pointer)&local_c90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c90,"adax","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_7b0,&local_c90,&local_daa);
  local_cb0[0] = local_ca0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cb0,"use adaptive learning rates with x^2 instead of g^2x^2","");
  std::__cxx11::string::_M_assign((string *)(local_7b0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_7b0);
  poVar11 = VW::config::option_group_definition::add<bool>(poVar11,&local_210);
  local_cd0._M_dataplus._M_p = (pointer)&local_cd0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cd0,"invariant","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_850,&local_cd0,&local_dac);
  local_cf0[0] = local_ce0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cf0,"use safe/importance aware updates.","");
  std::__cxx11::string::_M_assign((string *)(local_850 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2b0,(typed_option<bool> *)local_850);
  poVar11 = VW::config::option_group_definition::add<bool>(poVar11,&local_2b0);
  local_d10._M_dataplus._M_p = (pointer)&local_d10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d10,"normalized","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_8f0,&local_d10,&local_dad);
  local_d30[0] = local_d20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d30,"use per feature normalized updates","");
  std::__cxx11::string::_M_assign((string *)(local_8f0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_350,(typed_option<bool> *)local_8f0);
  poVar11 = VW::config::option_group_definition::add<bool>(poVar11,&local_350);
  local_d50._M_dataplus._M_p = (pointer)&local_d50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d50,"sparse_l2","");
  VW::config::typed_option<float>::typed_option
            (&local_490,&local_d50,
             &(local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->sparse_l2);
  ptVar12 = VW::config::typed_option<float>::default_value(&local_490,0.0);
  local_d70[0] = local_d60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d70,"use per feature normalized updates","");
  std::__cxx11::string::_M_assign((string *)&(ptVar12->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_3f0,ptVar12);
  local_d98 = options;
  poVar11 = VW::config::option_group_definition::add<float>(poVar11,&local_3f0);
  local_d90._M_dataplus._M_p = (pointer)&local_d90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d90,"l1_state","");
  VW::config::typed_option<double>::typed_option(&local_5d0,&local_d90,&all->sd->gravity);
  local_5d0.super_base_option.m_keep = all->save_resume;
  ptVar13 = VW::config::typed_option<double>::default_value(&local_5d0,0.0);
  local_b58[0] = local_b48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b58,"use per feature normalized updates","");
  std::__cxx11::string::_M_assign((string *)&(ptVar13->super_base_option).m_help);
  VW::config::typed_option<double>::typed_option(&local_530,ptVar13);
  poVar11 = VW::config::option_group_definition::add<double>(poVar11,&local_530);
  local_b78._M_dataplus._M_p = (pointer)&local_b78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b78,"l2_state","");
  VW::config::typed_option<double>::typed_option(&local_710,&local_b78,&all->sd->contraction);
  local_710.super_base_option.m_keep = all->save_resume;
  ptVar13 = VW::config::typed_option<double>::default_value(&local_710,1.0);
  local_b98[0] = local_b88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b98,"use per feature normalized updates","");
  std::__cxx11::string::_M_assign((string *)&(ptVar13->super_base_option).m_help);
  VW::config::typed_option<double>::typed_option(&local_670,ptVar13);
  VW::config::option_group_definition::add<double>(poVar11,&local_670);
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0578;
  if (local_670.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if (local_b98[0] != local_b88) {
    operator_delete(local_b98[0]);
  }
  local_710.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0578;
  if (local_710.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_710.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_710.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
    operator_delete(local_b78._M_dataplus._M_p);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0578;
  if (local_530.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if (local_b58[0] != local_b48) {
    operator_delete(local_b58[0]);
  }
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d0578;
  if (local_5d0.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5d0.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d90._M_dataplus._M_p != &local_d90.field_2) {
    operator_delete(local_d90._M_dataplus._M_p);
  }
  this = local_d98;
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cffa0;
  if (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_d70[0] != local_d60) {
    operator_delete(local_d70[0]);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cffa0;
  if (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d50._M_dataplus._M_p != &local_d50.field_2) {
    operator_delete(local_d50._M_dataplus._M_p);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cffd8;
  if (local_350.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_d30[0] != local_d20) {
    operator_delete(local_d30[0]);
  }
  local_8f0._0_8_ = &PTR__typed_option_002cffd8;
  if (local_858._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_858._M_pi);
  }
  if (local_868._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_868._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_8f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d10._M_dataplus._M_p != &local_d10.field_2) {
    operator_delete(local_d10._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cffd8;
  if (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_cf0[0] != local_ce0) {
    operator_delete(local_cf0[0]);
  }
  local_850._0_8_ = &PTR__typed_option_002cffd8;
  if (local_7b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7b8._M_pi);
  }
  if (local_7c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_850);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd0._M_dataplus._M_p != &local_cd0.field_2) {
    operator_delete(local_cd0._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cffd8;
  if (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_cb0[0] != local_ca0) {
    operator_delete(local_cb0[0]);
  }
  local_7b0._0_8_ = &PTR__typed_option_002cffd8;
  if (local_718._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_718._M_pi);
  }
  if (local_728._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_728._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_7b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c90._M_dataplus._M_p != &local_c90.field_2) {
    operator_delete(local_c90._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cffd8;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_c70[0] != local_c60) {
    operator_delete(local_c70[0]);
  }
  local_b18._0_8_ = &PTR__typed_option_002cffd8;
  if (local_a80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a80._M_pi);
  }
  if (local_a90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a90._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_b18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c50._M_dataplus._M_p != &local_c50.field_2) {
    operator_delete(local_c50._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cffd8;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_c30[0] != local_c20) {
    operator_delete(local_c30[0]);
  }
  local_a78._0_8_ = &PTR__typed_option_002cffd8;
  if (local_9e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9e0._M_pi);
  }
  if (local_9f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9f0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c10._M_dataplus._M_p != &local_c10.field_2) {
    operator_delete(local_c10._M_dataplus._M_p);
  }
  (**this->_vptr_options_i)(this,&local_bd0);
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->all = all;
  all->normalized_sum_norm_x = 0.0;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->no_win_counter = 0;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->total_weight = 0.0;
  fVar26 = -1.0;
  if (all->adaptive != false) {
    fVar26 = all->power_t + -1.0;
  }
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->neg_norm_power = fVar26;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->neg_power_t = -all->power_t;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->adaptive = all->adaptive;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->normalized = all->normalized_updates;
  if (0.0 < all->initial_t) {
    (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->all->normalized_sum_norm_x = (double)all->initial_t;
    (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->total_weight = (double)all->initial_t;
  }
  pp_Var1 = (_func_int **)(local_a78 + 0x10);
  local_a78._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"feature_mask","");
  iVar8 = (*this->_vptr_options_i[1])(this,local_a78);
  if ((_func_int **)local_a78._0_8_ != pp_Var1) {
    operator_delete((void *)local_a78._0_8_);
  }
  if (all->holdout_set_off == false) {
    all->sd->holdout_best_loss = 3.4028234663852886e+38;
    local_a78._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"early_terminate","");
    ptVar14 = VW::config::options_i::get_typed_option<unsigned_long>(this,(string *)local_a78);
    psVar2 = (ptVar14->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (psVar2 == (size_t *)0x0) {
      sVar15 = 0;
    }
    else {
      sVar15 = *psVar2;
    }
    (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->early_stop_thres = sVar15;
    if ((_func_int **)local_a78._0_8_ != pp_Var1) {
      operator_delete((void *)local_a78._0_8_);
    }
  }
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->initial_constant = all->initial_constant;
  if ((((local_da9 == false) && (local_dab == false)) && (local_dac == false)) &&
     (local_dad != true)) {
    bVar23 = all->training;
    all->adaptive = bVar23;
    all->invariant_updates = bVar23;
    all->normalized_updates = bVar23;
  }
  else {
    bVar25 = all->training == false;
    bVar7 = false;
    bVar23 = local_dab;
    if (bVar25) {
      bVar23 = bVar7;
    }
    all->adaptive = bVar23;
    bVar23 = local_dac;
    if (bVar25) {
      bVar23 = bVar7;
    }
    all->invariant_updates = bVar23;
    bVar23 = local_dad;
    if (bVar25) {
      bVar23 = bVar7;
    }
    all->normalized_updates = bVar23;
    local_a78._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"learning_rate","");
    iVar9 = (*this->_vptr_options_i[1])(this,local_a78);
    if ((char)iVar9 == '\0') {
      local_b18._0_8_ = local_b18 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b18,"l","");
      iVar10 = (*this->_vptr_options_i[1])(this,local_b18);
      if ((char)iVar10 != '\0') goto LAB_00163b09;
      bVar24 = all->normalized_updates & all->adaptive ^ 1;
    }
    else {
LAB_00163b09:
      bVar24 = 0;
    }
    if (((char)iVar9 == '\0') && ((undefined1 *)local_b18._0_8_ != local_b18 + 0x10)) {
      operator_delete((void *)local_b18._0_8_);
    }
    if ((_func_int **)local_a78._0_8_ != pp_Var1) {
      operator_delete((void *)local_a78._0_8_);
    }
    if (bVar24 != 0) {
      all->eta = 10.0;
    }
    if ((all->adaptive == false) && (all->normalized_updates == false)) {
      local_a78._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"initial_t","");
      iVar9 = (*this->_vptr_options_i[1])(this,local_a78);
      if ((_func_int **)local_a78._0_8_ != pp_Var1) {
        operator_delete((void *)local_a78._0_8_);
      }
      if ((char)iVar9 == '\0') {
        all->sd->t = 1.0;
        all->initial_t = 1.0;
      }
      fVar26 = powf((float)all->sd->t,all->power_t);
      all->eta = fVar26 * all->eta;
    }
  }
  if (local_daa == true) {
    (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->adax = all->training;
  }
  if (((local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
       _M_head_impl)->adax == true) && (all->adaptive == false)) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_a78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a78 + 0x10),"Cannot use adax without adaptive",0x20);
    this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd.cc"
               ,0x48e,&local_b38);
    __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  dVar5 = pow((double)all->eta_decay_rate,
              ((double)CONCAT44(0x45300000,(int)(all->numpasses >> 0x20)) - 1.9342813113834067e+25)
              + ((double)CONCAT44(0x43300000,(int)all->numpasses) - 4503599627370496.0));
  if (dVar5 < 0.0001) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(all->trace_message).super_ostream,
               "Warning: the learning rate for the last pass is multiplied by: ",0x3f);
    dVar5 = pow((double)all->eta_decay_rate,
                ((double)CONCAT44(0x45300000,(int)(all->numpasses >> 0x20)) - 1.9342813113834067e+25
                ) + ((double)CONCAT44(0x43300000,(int)all->numpasses) - 4503599627370496.0));
    poVar16 = std::ostream::_M_insert<double>(dVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16," adjust --decay_learning_rate larger to avoid this.",0x33);
    std::ios::widen((char)poVar16->_vptr_basic_ostream[-3] + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
  }
  if ((all->reg_mode & 1) == 0) {
    if (all->audit != false) {
      pcVar17 = predict<false,true>;
      pcVar20 = multipredict<false,true>;
      goto LAB_00163daa;
    }
    pcVar17 = predict<false,false>;
    bVar23 = all->hash_inv == false;
    if (!bVar23) {
      pcVar17 = predict<false,true>;
    }
    pcVar22 = multipredict<false,true>;
    pcVar20 = multipredict<false,false>;
  }
  else {
    if (all->audit != false) {
      pcVar20 = multipredict<true,true>;
      pcVar17 = predict<true,true>;
      goto LAB_00163daa;
    }
    pcVar17 = predict<true,false>;
    bVar23 = all->hash_inv == false;
    if (!bVar23) {
      pcVar17 = predict<true,true>;
    }
    pcVar22 = multipredict<true,true>;
    pcVar20 = multipredict<true,false>;
  }
  if (!bVar23) {
    pcVar20 = pcVar22;
  }
LAB_00163daa:
  bVar23 = (bool)((byte)iVar8 ^ 1);
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->predict = pcVar17;
  (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->multipredict = pcVar20;
  if ((all->power_t != 0.5) || (NAN(all->power_t))) {
    uVar18 = set_learn<false>(all,bVar23,
                              local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                              super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                              super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl);
  }
  else {
    uVar18 = set_learn<true>(all,bVar23,
                             local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                             super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl);
  }
  uVar18 = ceil_log_2(uVar18 - 1);
  if ((all->weights).sparse == true) {
    sparse_parameters::stride_shift(&(all->weights).sparse_weights,(uint32_t)uVar18);
  }
  else {
    (all->weights).dense_weights._stride_shift = (uint32_t)uVar18;
  }
  _Var6._M_head_impl =
       local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
       _M_head_impl;
  puVar21 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar21 = &(all->weights).sparse_weights._stride_shift;
  }
  plVar19 = LEARNER::init_learner<GD::gd,example,LEARNER::learner<char,char>>
                      (&local_da8,
                       (_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)
                       (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->learn,
                       (_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)
                       (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->predict,
                       1L << ((byte)*puVar21 & 0x3f));
  p_Var3 = (_Var6._M_head_impl)->sensitivity;
  uVar4 = *(undefined8 *)(plVar19 + 0x18);
  *(undefined8 *)(plVar19 + 0x48) = uVar4;
  *(_func_float_gd_ptr_base_learner_ptr_example_ptr **)(plVar19 + 0x50) = p_Var3;
  *(_func_void_gd_ptr_base_learner_ptr_example_ptr_size_t_size_t_polyprediction_ptr_bool **)
   (plVar19 + 0x40) = (_Var6._M_head_impl)->multipredict;
  *(_func_void_gd_ptr_base_learner_ptr_example_ptr **)(plVar19 + 0x38) =
       (_Var6._M_head_impl)->update;
  *(code **)(plVar19 + 0x80) = save_load;
  *(undefined8 *)(plVar19 + 0x70) = uVar4;
  *(undefined8 *)(plVar19 + 0x78) = *(undefined8 *)(plVar19 + 0x20);
  *(undefined8 *)(plVar19 + 0x88) = uVar4;
  *(undefined8 *)(plVar19 + 0x90) = *(undefined8 *)(plVar19 + 0x20);
  *(code **)(plVar19 + 0x98) = end_pass;
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_bd0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd0.m_name._M_dataplus._M_p != &local_bd0.m_name.field_2) {
    operator_delete(local_bd0.m_name._M_dataplus._M_p);
  }
  if (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
      _M_head_impl != (gd *)0x0) {
    (*(code *)local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_da8._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl);
  }
  return (base_learner *)plVar19;
}

Assistant:

base_learner* setup(options_i& options, vw& all)
{
  auto g = scoped_calloc_or_throw<gd>();

  bool sgd = false;
  bool adaptive = false;
  bool adax = false;
  bool invariant = false;
  bool normalized = false;

  option_group_definition new_options("Gradient Descent options");
  new_options.add(make_option("sgd", sgd).help("use regular stochastic gradient descent update."))
      .add(make_option("adaptive", adaptive).help("use adaptive, individual learning rates."))
      .add(make_option("adax", adax).help("use adaptive learning rates with x^2 instead of g^2x^2"))
      .add(make_option("invariant", invariant).help("use safe/importance aware updates."))
      .add(make_option("normalized", normalized).help("use per feature normalized updates"))
      .add(make_option("sparse_l2", g->sparse_l2).default_value(0.f).help("use per feature normalized updates"))
      .add(make_option("l1_state", all.sd->gravity)
               .keep(all.save_resume)
               .default_value(0.)
               .help("use per feature normalized updates"))
      .add(make_option("l2_state", all.sd->contraction)
               .keep(all.save_resume)
               .default_value(1.)
               .help("use per feature normalized updates"));
  options.add_and_parse(new_options);

  g->all = &all;
  g->all->normalized_sum_norm_x = 0;
  g->no_win_counter = 0;
  g->total_weight = 0.;
  g->neg_norm_power = (all.adaptive ? (all.power_t - 1.f) : -1.f);
  g->neg_power_t = -all.power_t;
  g->adaptive = all.adaptive;
  g->normalized = all.normalized_updates;

  if (all.initial_t > 0)  // for the normalized update: if initial_t is bigger than 1 we interpret this as if we had
                          // seen (all.initial_t) previous fake datapoints all with norm 1
  {
    g->all->normalized_sum_norm_x = all.initial_t;
    g->total_weight = all.initial_t;
  }

  bool feature_mask_off = true;
  if (options.was_supplied("feature_mask"))
    feature_mask_off = false;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    g->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  g->initial_constant = all.initial_constant;

  if (sgd || adaptive || invariant || normalized)
  {
    // nondefault
    all.adaptive = all.training && adaptive;
    all.invariant_updates = all.training && invariant;
    all.normalized_updates = all.training && normalized;

    if (!options.was_supplied("learning_rate") && !options.was_supplied("l") &&
        !(all.adaptive && all.normalized_updates))
      all.eta = 10;  // default learning rate to 10 for non default update rule

    // if not using normalized or adaptive, default initial_t to 1 instead of 0
    if (!all.adaptive && !all.normalized_updates)
    {
      if (!options.was_supplied("initial_t"))
      {
        all.sd->t = 1.f;
        all.initial_t = 1.f;
      }
      all.eta *= powf((float)(all.sd->t), all.power_t);
    }
  }
  else
  {
    all.adaptive = all.training;
    all.invariant_updates = all.training;
    all.normalized_updates = all.training;
  }

  if (adax)
    g->adax = all.training && adax;

  if (g->adax && !all.adaptive)
    THROW("Cannot use adax without adaptive");

  if (pow((double)all.eta_decay_rate, (double)all.numpasses) < 0.0001)
    all.trace_message << "Warning: the learning rate for the last pass is multiplied by: "
                      << pow((double)all.eta_decay_rate, (double)all.numpasses)
                      << " adjust --decay_learning_rate larger to avoid this." << endl;

  if (all.reg_mode % 2)
    if (all.audit || all.hash_inv)
    {
      g->predict = predict<true, true>;
      g->multipredict = multipredict<true, true>;
    }
    else
    {
      g->predict = predict<true, false>;
      g->multipredict = multipredict<true, false>;
    }
  else if (all.audit || all.hash_inv)
  {
    g->predict = predict<false, true>;
    g->multipredict = multipredict<false, true>;
  }
  else
  {
    g->predict = predict<false, false>;
    g->multipredict = multipredict<false, false>;
  }

  uint64_t stride;
  if (all.power_t == 0.5)
    stride = set_learn<true>(all, feature_mask_off, *g.get());
  else
    stride = set_learn<false>(all, feature_mask_off, *g.get());

  all.weights.stride_shift((uint32_t)ceil_log_2(stride - 1));

  gd* bare = g.get();
  learner<gd, example>& ret = init_learner(g, g->learn, bare->predict, ((uint64_t)1 << all.weights.stride_shift()));
  ret.set_sensitivity(bare->sensitivity);
  ret.set_multipredict(bare->multipredict);
  ret.set_update(bare->update);
  ret.set_save_load(save_load);
  ret.set_end_pass(end_pass);
  return make_base(ret);
}